

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockSymbols.cpp
# Opt level: O0

ProceduralBlockSymbol *
slang::ast::ProceduralBlockSymbol::createProceduralBlock
          (Scope *scope,ProceduralBlockKind kind,SourceLocation location,MemberSyntax *syntax,
          StatementSyntax *stmtSyntax,
          span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL>
          *additionalBlocks)

{
  Scope *scope_00;
  Compilation *this;
  ProceduralBlockSymbol *this_00;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL> sVar1;
  pointer local_68;
  size_type local_60;
  ProceduralBlockSymbol *result;
  Compilation *comp;
  span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL>
  *additionalBlocks_local;
  StatementSyntax *stmtSyntax_local;
  MemberSyntax *syntax_local;
  Scope *pSStack_18;
  ProceduralBlockKind kind_local;
  Scope *scope_local;
  SourceLocation location_local;
  
  syntax_local._4_4_ = kind;
  pSStack_18 = scope;
  scope_local = (Scope *)location;
  this = Scope::getCompilation(scope);
  this_00 = BumpAllocator::
            emplace<slang::ast::ProceduralBlockSymbol,slang::SourceLocation&,slang::ast::ProceduralBlockKind&>
                      (&this->super_BumpAllocator,(SourceLocation *)&scope_local,
                       (ProceduralBlockKind *)((long)&syntax_local + 4));
  Symbol::setSyntax(&this_00->super_Symbol,&syntax->super_SyntaxNode);
  scope_00 = pSStack_18;
  syntax_00 = slang::syntax::SyntaxList::operator_cast_to_span((SyntaxList *)&syntax->attributes);
  Symbol::setAttributes(&this_00->super_Symbol,scope_00,syntax_00);
  sVar1 = Statement::createBlockItems(pSStack_18,stmtSyntax,false);
  local_68 = sVar1.data_;
  (this_00->blocks).data_ = local_68;
  local_60 = sVar1.size_;
  (this_00->blocks).size_ = local_60;
  this_00->stmtSyntax = stmtSyntax;
  additionalBlocks->data_ = (this_00->blocks).data_;
  additionalBlocks->size_ = (this_00->blocks).size_;
  return this_00;
}

Assistant:

ProceduralBlockSymbol& ProceduralBlockSymbol::createProceduralBlock(
    const Scope& scope, ProceduralBlockKind kind, SourceLocation location,
    const MemberSyntax& syntax, const StatementSyntax& stmtSyntax,
    span<const StatementBlockSymbol* const>& additionalBlocks) {

    auto& comp = scope.getCompilation();
    auto result = comp.emplace<ProceduralBlockSymbol>(location, kind);
    result->setSyntax(syntax);
    result->setAttributes(scope, syntax.attributes);
    result->blocks = Statement::createBlockItems(scope, stmtSyntax, /* labelHandled */ false);
    result->stmtSyntax = &stmtSyntax;

    additionalBlocks = result->blocks;

    return *result;
}